

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_longest_match64_inc.h
# Opt level: O3

void PrepareH6(HasherHandle handle,int one_shot,size_t input_size,uint8_t *data)

{
  undefined4 uVar1;
  ulong uVar2;
  ulong uVar3;
  HasherHandle __s;
  size_t sVar4;
  
  __s = handle + 0x50;
  if (*(ulong *)(handle + 0x28) >> 6 < input_size || one_shot == 0) {
    memset(__s,0,*(ulong *)(handle + 0x28) * 2);
    return;
  }
  if (input_size != 0) {
    uVar2 = *(ulong *)(handle + 0x40);
    uVar1 = *(undefined4 *)(handle + 0x38);
    sVar4 = 0;
    do {
      uVar3 = *(ulong *)(data + sVar4);
      (__s + ((uVar3 & uVar2) * 0x1fe35a7bd3579bd3 >> ((byte)uVar1 & 0x3f) & 0xffffffff) * 2)[0] =
           '\0';
      (__s + ((uVar3 & uVar2) * 0x1fe35a7bd3579bd3 >> ((byte)uVar1 & 0x3f) & 0xffffffff) * 2)[1] =
           '\0';
      sVar4 = sVar4 + 1;
    } while (input_size != sVar4);
  }
  return;
}

Assistant:

static void FN(Prepare)(HasherHandle handle, BROTLI_BOOL one_shot,
    size_t input_size, const uint8_t* data) {
  HashLongestMatch* self = FN(Self)(handle);
  uint16_t* num = FN(Num)(self);
  /* Partial preparation is 100 times slower (per socket). */
  size_t partial_prepare_threshold = self->bucket_size_ >> 6;
  if (one_shot && input_size <= partial_prepare_threshold) {
    size_t i;
    for (i = 0; i < input_size; ++i) {
      const uint32_t key = FN(HashBytes)(&data[i], self->hash_mask_,
                                         self->hash_shift_);
      num[key] = 0;
    }
  } else {
    memset(num, 0, self->bucket_size_ * sizeof(num[0]));
  }
}